

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::SystemInformationImplementation
          (SystemInformationImplementation *this)

{
  (this->ChipID).ProcessorName._M_dataplus._M_p = (pointer)&(this->ChipID).ProcessorName.field_2;
  (this->ChipID).ProcessorName._M_string_length = 0;
  (this->ChipID).ProcessorName.field_2._M_local_buf[0] = '\0';
  (this->ChipID).Vendor._M_dataplus._M_p = (pointer)&(this->ChipID).Vendor.field_2;
  (this->ChipID).Vendor._M_string_length = 0;
  (this->ChipID).Vendor.field_2._M_local_buf[0] = '\0';
  (this->ChipID).SerialNumber._M_dataplus._M_p = (pointer)&(this->ChipID).SerialNumber.field_2;
  (this->ChipID).SerialNumber._M_string_length = 0;
  (this->ChipID).SerialNumber.field_2._M_local_buf[0] = '\0';
  (this->ChipID).ModelName._M_dataplus._M_p = (pointer)&(this->ChipID).ModelName.field_2;
  (this->ChipID).ModelName._M_string_length = 0;
  (this->ChipID).ModelName.field_2._M_local_buf[0] = '\0';
  (this->SysCtlBuffer)._M_dataplus._M_p = (pointer)&(this->SysCtlBuffer).field_2;
  (this->SysCtlBuffer)._M_string_length = 0;
  (this->SysCtlBuffer).field_2._M_local_buf[0] = '\0';
  (this->OSName)._M_dataplus._M_p = (pointer)&(this->OSName).field_2;
  (this->OSName)._M_string_length = 0;
  (this->OSName).field_2._M_local_buf[0] = '\0';
  (this->Hostname)._M_dataplus._M_p = (pointer)&(this->Hostname).field_2;
  (this->Hostname)._M_string_length = 0;
  (this->Hostname).field_2._M_local_buf[0] = '\0';
  (this->OSRelease)._M_dataplus._M_p = (pointer)&(this->OSRelease).field_2;
  (this->OSRelease)._M_string_length = 0;
  (this->OSRelease).field_2._M_local_buf[0] = '\0';
  (this->OSVersion)._M_dataplus._M_p = (pointer)&(this->OSVersion).field_2;
  (this->OSVersion)._M_string_length = 0;
  (this->OSVersion).field_2._M_local_buf[0] = '\0';
  (this->OSPlatform)._M_dataplus._M_p = (pointer)&(this->OSPlatform).field_2;
  (this->OSPlatform)._M_string_length = 0;
  (this->OSPlatform).field_2._M_local_buf[0] = '\0';
  this->CurrentPositionInFile = 0;
  this->TotalPhysicalMemory = 0;
  this->AvailablePhysicalMemory = 0;
  this->TotalVirtualMemory = 0;
  this->AvailableVirtualMemory = 0;
  this->ChipManufacturer = UnknownManufacturer;
  this->CPUSpeedInMHz = 0.0;
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  (this->ChipID).Model = 0;
  (this->ChipID).Revision = 0;
  (this->ChipID).ExtendedFamily = 0;
  (this->ChipID).ExtendedModel = 0;
  *(undefined8 *)&(this->Features).ExtendedFeatures.PowerManagement = 0;
  (this->ChipID).Family = 0;
  (this->ChipID).Model = 0;
  (this->Features).ExtendedFeatures.Has3DNow = false;
  (this->Features).ExtendedFeatures.Has3DNowPlus = false;
  (this->Features).ExtendedFeatures.SupportsMP = false;
  (this->Features).ExtendedFeatures.HasMMXPlus = false;
  (this->Features).ExtendedFeatures.HasSSEMMX = false;
  *(undefined3 *)&(this->Features).ExtendedFeatures.field_0x5 = 0;
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = 0;
  (this->Features).ExtendedFeatures.APIC_ID = 0;
  (this->Features).CPUSpeed = 0;
  (this->Features).L1CacheSize = 0;
  (this->Features).L2CacheSize = 0;
  (this->Features).L3CacheSize = 0;
  (this->Features).HasFPU = false;
  (this->Features).HasTSC = false;
  (this->Features).HasMMX = false;
  (this->Features).HasSSE = false;
  (this->Features).HasSSEFP = false;
  (this->Features).HasSSE2 = false;
  (this->Features).HasIA64 = false;
  (this->Features).HasAPIC = false;
  (this->Features).HasCMOV = false;
  (this->Features).HasMTRR = false;
  (this->Features).HasACPI = false;
  (this->Features).HasSerial = false;
  (this->Features).HasThermal = false;
  *(undefined3 *)&(this->Features).field_0xd = 0;
  std::__cxx11::string::_M_replace((ulong)&this->OSName,0,(char *)0x0,0x7bf049);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Hostname,0,(char *)(this->Hostname)._M_string_length,0x7bf049);
  std::__cxx11::string::_M_replace
            ((ulong)&this->OSRelease,0,(char *)(this->OSRelease)._M_string_length,0x7bf049);
  std::__cxx11::string::_M_replace
            ((ulong)&this->OSVersion,0,(char *)(this->OSVersion)._M_string_length,0x7bf049);
  std::__cxx11::string::_M_replace
            ((ulong)&this->OSPlatform,0,(char *)(this->OSPlatform)._M_string_length,0x7bf049);
  this->OSIs64Bit = true;
  return;
}

Assistant:

SystemInformationImplementation::SystemInformationImplementation()
{
  this->TotalVirtualMemory = 0;
  this->AvailableVirtualMemory = 0;
  this->TotalPhysicalMemory = 0;
  this->AvailablePhysicalMemory = 0;
  this->CurrentPositionInFile = 0;
  this->ChipManufacturer = UnknownManufacturer;
  memset(&this->Features, 0, sizeof(CPUFeatures));
  this->ChipID.Type = 0;
  this->ChipID.Family = 0;
  this->ChipID.Model = 0;
  this->ChipID.Revision = 0;
  this->ChipID.ExtendedFamily = 0;
  this->ChipID.ExtendedModel = 0;
  this->CPUSpeedInMHz = 0;
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  this->OSName = "";
  this->Hostname = "";
  this->OSRelease = "";
  this->OSVersion = "";
  this->OSPlatform = "";
  this->OSIs64Bit = (sizeof(void*) == 8);
}